

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvers.h
# Opt level: O2

void __thiscall
dlib::sgd::update_considering_bias<dlib::con_<2048l,1l,1l,1,1,0,0>>
          (sgd *this,float learning_rate,con_<2048L,_1L,_1L,_1,_1,_0,_0> *l,tensor *params_grad,
          unsigned_long bias_offset)

{
  uint *puVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ostream *poVar6;
  fatal_error *this_00;
  undefined1 auVar7 [16];
  float B;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  string local_1c0;
  ostringstream dlib_o_out;
  uint auStack_188 [88];
  
  if ((l->params).super_tensor.m_size == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dlib_o_out);
    poVar6 = std::operator<<((ostream *)&dlib_o_out,"\n\nError detected at line ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x9f);
    std::operator<<(poVar6,".\n");
    poVar6 = std::operator<<((ostream *)&dlib_o_out,"Error detected in file ");
    poVar6 = std::operator<<(poVar6,
                             "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/../dlib/dnn/solvers.h"
                            );
    std::operator<<(poVar6,".\n");
    poVar6 = std::operator<<((ostream *)&dlib_o_out,"Error detected in function ");
    poVar6 = std::operator<<(poVar6,
                             "void dlib::sgd::update_considering_bias(const float, const layer_type &, const tensor &, unsigned long) [layer_type = dlib::con_<2048, 1, 1, 1, 1>]"
                            );
    std::operator<<(poVar6,".\n\n");
    poVar6 = std::operator<<((ostream *)&dlib_o_out,"Failing expression was ");
    poVar6 = std::operator<<(poVar6,"params.size() != 0");
    std::operator<<(poVar6,".\n");
    puVar1 = (uint *)((long)auStack_188 + *(long *)(_dlib_o_out + -0x18));
    *puVar1 = *puVar1 | 1;
    poVar6 = std::operator<<((ostream *)&dlib_o_out,"");
    std::operator<<(poVar6,"\n");
    this_00 = (fatal_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::stringbuf::str();
    fatal_error::fatal_error(this_00,EBROKEN_ASSERT,&local_1c0);
    __cxa_throw(this_00,&fatal_error::typeinfo,error::~error);
  }
  if ((this->v).super_tensor.m_size == 0) {
    resizable_tensor::copy_size(&this->v,params_grad);
    tensor::operator=((tensor *)this,0.0);
  }
  auVar8._8_8_ = 0;
  auVar8._0_8_ = l->weight_decay_multiplier;
  dVar2 = (double)learning_rate * l->learning_rate_multiplier;
  auVar7._12_4_ = 0x80000000;
  auVar7._0_12_ = ZEXT812(0x8000000000000000);
  auVar7 = vxorpd_avx512vl(auVar8,auVar7);
  dVar3 = auVar7._0_8_ * (double)this->weight_decay;
  auVar9._0_4_ = (float)dVar2;
  auVar9._4_4_ = (int)((ulong)dVar2 >> 0x20);
  auVar9._8_8_ = 0;
  auVar4._8_4_ = 0x80000000;
  auVar4._0_8_ = 0x8000000080000000;
  auVar4._12_4_ = 0x80000000;
  auVar7 = vxorps_avx512vl(auVar9,auVar4);
  B = (float)(dVar2 * dVar3);
  if ((((l->bias_learning_rate_multiplier == 1.0) && (!NAN(l->bias_learning_rate_multiplier))) &&
      (l->bias_weight_decay_multiplier == 1.0)) && (!NAN(l->bias_weight_decay_multiplier))) {
    tt::affine_transform
              ((tensor *)this,(tensor *)this,(tensor *)l,params_grad,this->momentum,B,auVar7._0_4_);
    return;
  }
  tt::affine_transform_range
            (0,bias_offset,(tensor *)this,(tensor *)this,(tensor *)l,params_grad,this->momentum,B,
             auVar7._0_4_);
  dVar2 = dVar2 * l->bias_learning_rate_multiplier;
  auVar10._0_4_ = (float)dVar2;
  auVar10._4_4_ = (int)((ulong)dVar2 >> 0x20);
  auVar10._8_8_ = 0;
  auVar5._8_4_ = 0x80000000;
  auVar5._0_8_ = 0x8000000080000000;
  auVar5._12_4_ = 0x80000000;
  auVar7 = vxorps_avx512vl(auVar10,auVar5);
  tt::affine_transform_range
            (bias_offset,(this->v).super_tensor.m_size,(tensor *)this,(tensor *)this,(tensor *)l,
             params_grad,this->momentum,(float)(dVar2 * dVar3 * l->bias_weight_decay_multiplier),
             auVar7._0_4_);
  return;
}

Assistant:

void update_considering_bias(
            const float learning_rate,
            const layer_type& l,
            const tensor& params_grad,
            unsigned long bias_offset
        )
        {
            const tensor& params = l.get_layer_params();

            DLIB_CASSERT(params.size() != 0);
            if (v.size() == 0)
            {
                v.copy_size(params_grad);
                v = 0;
            }

            double lr = learning_rate*get_learning_rate_multiplier(l);
            double wd = weight_decay*get_weight_decay_multiplier(l);
            
            //perform: v = momentum*mat(v) - wd*lr*mat(params) - lr*mat(params_grad);

            if (l.get_bias_learning_rate_multiplier() == 1 && l.get_bias_weight_decay_multiplier() == 1)
            {
                tt::affine_transform(v, v, params, params_grad, momentum, -wd*lr, -lr);
            }
            else
            {

                tt::affine_transform_range(0, bias_offset, v, v, params, params_grad, momentum, -wd*lr, -lr);

                // now update the biases but apply their multipliers
                lr *= l.get_bias_learning_rate_multiplier();
                wd *= l.get_bias_weight_decay_multiplier();
                tt::affine_transform_range(bias_offset, v.size(), v, v, params, params_grad, momentum, -wd*lr, -lr);
            }
        }